

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

int kwsysProcessCreate(cmsysProcess *cp,int prIndex,kwsysProcessCreateInformation *si)

{
  int iVar1;
  pid_t pVar2;
  int *piVar3;
  bool bVar4;
  long local_38;
  kwsysProcess_ssize_t n;
  kwsysProcess_ssize_t total;
  kwsysProcessCreateInformation *si_local;
  int prIndex_local;
  cmsysProcess *cp_local;
  
  iVar1 = pipe(si->ErrorPipe);
  if (iVar1 < 0) {
    cp_local._4_4_ = 0;
  }
  else {
    iVar1 = fcntl64(si->ErrorPipe[1],2,1);
    if (iVar1 < 0) {
      cp_local._4_4_ = 0;
    }
    else {
      pVar2 = kwsysProcessFork(cp,si);
      cp->ForkPIDs[prIndex] = pVar2;
      if (cp->ForkPIDs[prIndex] < 0) {
        cp_local._4_4_ = 0;
      }
      else {
        if (cp->ForkPIDs[prIndex] == 0) {
          close(si->ErrorPipe[0]);
          if (si->StdIn < 1) {
            if (si->StdIn < 0) {
              close(0);
            }
          }
          else {
            dup2(si->StdIn,0);
          }
          if (si->StdOut != 1) {
            dup2(si->StdOut,1);
          }
          if (si->StdErr != 2) {
            dup2(si->StdErr,2);
          }
          fcntl64(0,2);
          fcntl64(1,2,0);
          fcntl64(2,2,0);
          kwsysProcessRestoreDefaultSignalHandlers();
          execvp(*cp->Commands[prIndex],cp->Commands[prIndex]);
          kwsysProcessChildErrorExit(si->ErrorPipe[1]);
        }
        cp->CommandsLeft = cp->CommandsLeft + 1;
        kwsysProcessCleanupDescriptor(si->ErrorPipe + 1);
        n = 0;
        local_38 = 1;
        while (n < 0x400 && 0 < local_38) {
          do {
            local_38 = read(si->ErrorPipe[0],cp->ErrorMessage + n,0x400 - n);
            bVar4 = false;
            if (local_38 < 0) {
              piVar3 = __errno_location();
              bVar4 = *piVar3 == 4;
            }
          } while (bVar4);
          if (0 < local_38) {
            n = local_38 + n;
          }
        }
        kwsysProcessCleanupDescriptor(si->ErrorPipe);
        if (n < 1) {
          cp_local._4_4_ = 1;
        }
        else {
          cp_local._4_4_ = 0;
        }
      }
    }
  }
  return cp_local._4_4_;
}

Assistant:

static int kwsysProcessCreate(kwsysProcess* cp, int prIndex,
                              kwsysProcessCreateInformation* si)
{
  /* Create the error reporting pipe.  */
  if(pipe(si->ErrorPipe) < 0)
    {
    return 0;
    }

  /* Set close-on-exec flag on the error pipe's write end.  */
  if(fcntl(si->ErrorPipe[1], F_SETFD, FD_CLOEXEC) < 0)
    {
    return 0;
    }

  /* Fork off a child process.  */
#if defined(__VMS)
  /* VMS needs vfork and execvp to be in the same function because
     they use setjmp/longjmp to run the child startup code in the
     parent!  TODO: OptionDetach.  */
  cp->ForkPIDs[prIndex] = vfork();
#else
  cp->ForkPIDs[prIndex] = kwsysProcessFork(cp, si);
#endif
  if(cp->ForkPIDs[prIndex] < 0)
    {
    return 0;
    }

  if(cp->ForkPIDs[prIndex] == 0)
    {
#if defined(__VMS)
    /* Specify standard pipes for child process.  */
    decc$set_child_standard_streams(si->StdIn, si->StdOut, si->StdErr);
#else
    /* Close the read end of the error reporting pipe.  */
    close(si->ErrorPipe[0]);

    /* Setup the stdin, stdout, and stderr pipes.  */
    if(si->StdIn > 0)
      {
      dup2(si->StdIn, 0);
      }
    else if(si->StdIn < 0)
      {
      close(0);
      }
    if(si->StdOut != 1)
      {
      dup2(si->StdOut, 1);
      }
    if(si->StdErr != 2)
      {
      dup2(si->StdErr, 2);
      }

    /* Clear the close-on-exec flag for stdin, stdout, and stderr.
       All other pipe handles will be closed when exec succeeds.  */
    fcntl(0, F_SETFD, 0);
    fcntl(1, F_SETFD, 0);
    fcntl(2, F_SETFD, 0);

    /* Restore all default signal handlers. */
    kwsysProcessRestoreDefaultSignalHandlers();
#endif

    /* Execute the real process.  If successful, this does not return.  */
    execvp(cp->Commands[prIndex][0], cp->Commands[prIndex]);
    /* TODO: What does VMS do if the child fails to start?  */

    /* Failure.  Report error to parent and terminate.  */
    kwsysProcessChildErrorExit(si->ErrorPipe[1]);
    }

#if defined(__VMS)
  /* Restore the standard pipes of this process.  */
  decc$set_child_standard_streams(0, 1, 2);
#endif

  /* A child has been created.  */
  ++cp->CommandsLeft;

  /* We are done with the error reporting pipe write end.  */
  kwsysProcessCleanupDescriptor(&si->ErrorPipe[1]);

  /* Block until the child's exec call succeeds and closes the error
     pipe or writes data to the pipe to report an error.  */
  {
  kwsysProcess_ssize_t total = 0;
  kwsysProcess_ssize_t n = 1;
  /* Read the entire error message up to the length of our buffer.  */
  while(total < KWSYSPE_PIPE_BUFFER_SIZE && n > 0)
    {
    /* Keep trying to read until the operation is not interrupted.  */
    while(((n = read(si->ErrorPipe[0], cp->ErrorMessage+total,
                     (size_t)(KWSYSPE_PIPE_BUFFER_SIZE-total))) < 0) &&
          (errno == EINTR));
    if(n > 0)
      {
      total += n;
      }
    }

  /* We are done with the error reporting pipe read end.  */
  kwsysProcessCleanupDescriptor(&si->ErrorPipe[0]);

  if(total > 0)
    {
    /* The child failed to execute the process.  */
    return 0;
    }
  }

  return 1;
}